

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int read_and_check_crc(spng_ctx *ctx)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uchar *data;
  uint uVar4;
  
  iVar2 = (*(code *)ctx->read_fn)(ctx,ctx->stream_user_ptr,ctx->stream_buf,4);
  if (iVar2 == 0) {
    uVar1 = ctx->bytes_read;
    ctx->bytes_read = uVar1 + 4;
    uVar3 = 3;
    if (uVar1 < 0xfffffffffffffffc) {
      uVar3 = *(uint *)ctx->data;
      uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      (ctx->current_chunk).crc = uVar4;
      uVar3 = 0;
      if (((ctx->field_0xcc & 0x80) == 0) && (ctx->cur_actual_crc != uVar4)) {
        if (((ctx->current_chunk).type[0] & 0x20) == 0) {
          uVar3 = 0x12;
          if (ctx->crc_action_critical == 2) {
            uVar3 = 0;
          }
        }
        else {
          uVar3 = 0;
          if (ctx->crc_action_ancillary != 2) {
            uVar3 = -(uint)(ctx->crc_action_ancillary == 1) | 0x12;
          }
        }
      }
    }
  }
  else {
    uVar3 = 0xfffffffe;
    if (iVar2 == -1) {
      uVar3 = 0xffffffff;
    }
  }
  return uVar3;
}

Assistant:

static inline int read_and_check_crc(spng_ctx *ctx)
{
    if(ctx == NULL) return SPNG_EINTERNAL;

    int ret;
    ret = read_data(ctx, 4);
    if(ret) return ret;

    ctx->current_chunk.crc = read_u32(ctx->data);

    if(ctx->skip_crc) return 0;

    if(ctx->cur_actual_crc != ctx->current_chunk.crc)
    {
        if(is_critical_chunk(&ctx->current_chunk))
        {
            if(ctx->crc_action_critical == SPNG_CRC_USE) return 0;
        }
        else
        {
            if(ctx->crc_action_ancillary == SPNG_CRC_USE) return 0;
            if(ctx->crc_action_ancillary == SPNG_CRC_DISCARD) return -SPNG_CRC_DISCARD;
        }

        return SPNG_ECHUNK_CRC;
    }

    return 0;
}